

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnThrowRefExpr(BinaryReaderInterp *this)

{
  bool bVar1;
  Location local_40;
  Enum local_1c;
  BinaryReaderInterp *local_18;
  BinaryReaderInterp *this_local;
  
  local_18 = this;
  GetLocation(&local_40,this);
  local_1c = (Enum)SharedValidator::OnThrowRef(&this->validator_,&local_40);
  bVar1 = Failed((Result)local_1c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,ThrowRef);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnThrowRefExpr() {
  CHECK_RESULT(validator_.OnThrowRef(GetLocation()));
  istream_.Emit(Opcode::ThrowRef);
  return Result::Ok;
}